

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall
entityx::EventManager::subscribe<entityx::ComponentAddedEvent<A>,entityx::deps::Dependency<A,B,C>>
          (EventManager *this,Dependency<A,_B,_C> *receiver)

{
  int iVar1;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this_00;
  undefined4 extraout_var;
  pair<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  *__x;
  socklen_t __len;
  sockaddr *__addr;
  long in_RSI;
  BaseReceiver *base;
  size_t connection;
  EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> wrapper;
  EventSignalPtr sig;
  offset_in_Dependency<A,_B,_C>_to_subr receive;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  *in_stack_fffffffffffffea0;
  _Bind<void_(entityx::deps::Dependency<A,_B,_C>::*(entityx::deps::Dependency<A,_B,_C>_*,_std::_Placeholder<1>))(const_entityx::ComponentAddedEvent<A>_&)>
  *in_stack_fffffffffffffea8;
  function<void_(const_entityx::ComponentAddedEvent<A>_&)> *in_stack_fffffffffffffeb0;
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  *this_01;
  size_t in_stack_fffffffffffffeb8;
  EventManager *in_stack_fffffffffffffec0;
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  local_120;
  long local_d0;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  long local_90;
  code *local_20;
  undefined8 local_18;
  long local_10;
  undefined8 uVar2;
  
  local_20 = deps::Dependency<A,_B,_C>::receive;
  local_18 = 0;
  local_10 = in_RSI;
  Event<entityx::ComponentAddedEvent<A>_>::family();
  signal_for(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  Catch::clara::std::
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::shared_ptr
            ((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
              *)in_stack_fffffffffffffea0,
             (shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
              *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  local_90 = local_10;
  __len = 0x382430;
  std::
  bind<void(entityx::deps::Dependency<A,B,C>::*&)(entityx::ComponentAddedEvent<A>const&),entityx::deps::Dependency<A,B,C>*,std::_Placeholder<1>const&>
            (&in_stack_fffffffffffffea8->_M_f,(Dependency<A,_B,_C> **)in_stack_fffffffffffffea0,
             (_Placeholder<1> *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::function<void(entityx::ComponentAddedEvent<A>const&)>::
  function<std::_Bind<void(entityx::deps::Dependency<A,B,C>::*(entityx::deps::Dependency<A,B,C>*,std::_Placeholder<1>))(entityx::ComponentAddedEvent<A>const&)>,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  EventCallbackWrapper<entityx::ComponentAddedEvent<A>_>::EventCallbackWrapper
            ((EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> *)in_stack_fffffffffffffea0,
             (function<void_(const_entityx::ComponentAddedEvent<A>_&)> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  Catch::clara::std::function<void_(const_entityx::ComponentAddedEvent<A>_&)>::~function
            ((function<void_(const_entityx::ComponentAddedEvent<A>_&)> *)0x2c2742);
  this_00 = &Catch::clara::std::
             __shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2c274f)->
             super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>;
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::ComponentAddedEvent<A>>&,void>
            ((function<void_(const_void_*)> *)in_stack_fffffffffffffeb0,
             (EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> *)in_stack_fffffffffffffea8);
  iVar1 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          connect(this_00,(int)local_c8,__addr,__len);
  uVar2 = CONCAT44(extraout_var,iVar1);
  Catch::clara::std::function<void_(const_void_*)>::~function
            ((function<void_(const_void_*)> *)0x2c2791);
  local_d0 = local_10 + 8;
  __x = (pair<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
         *)(local_10 + 0x10);
  local_a8 = uVar2;
  local_120._M_h._M_rehash_policy._M_next_resize = Event<entityx::ComponentAddedEvent<A>_>::family()
  ;
  this_01 = &local_120;
  std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>::
  weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,void>
            (&in_stack_fffffffffffffea0->first,
             (shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
              *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::
  make_pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long&>
            ((weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *
             )__x,(unsigned_long *)in_stack_fffffffffffffea0);
  std::
  make_pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>
            (&__x->first,in_stack_fffffffffffffea0);
  std::
  unordered_map<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>>
  ::
  insert<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            (this_01,__x);
  Catch::clara::std::
  pair<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  ::~pair((pair<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
           *)0x2c2849);
  Catch::clara::std::
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  ::~pair((pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
           *)0x2c2853);
  Catch::clara::std::
  weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::~weak_ptr
            ((weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *
             )0x2c285d);
  EventCallbackWrapper<entityx::ComponentAddedEvent<A>_>::~EventCallbackWrapper
            ((EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> *)0x2c286a);
  Catch::clara::std::
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
  ~shared_ptr((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
               *)0x2c2877);
  return;
}

Assistant:

void subscribe(Receiver &receiver) {
    void (Receiver::*receive)(const E &) = &Receiver::receive;
    auto sig = signal_for(Event<E>::family());
    auto wrapper = EventCallbackWrapper<E>(std::bind(receive, &receiver, std::placeholders::_1));
    auto connection = sig->connect(wrapper);
    BaseReceiver &base = receiver;
    base.connections_.insert(std::make_pair(Event<E>::family(), std::make_pair(EventSignalWeakPtr(sig), connection)));
  }